

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mesh.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::Mesh::sync_array<signed_char>(Mesh *this,Int ent_dim,Read<signed_char> *a,Int width)

{
  bool bVar1;
  char *file;
  undefined4 in_register_0000000c;
  Read<signed_char> *pRVar2;
  void *extraout_RDX;
  undefined4 in_register_00000034;
  Read<signed_char> RVar3;
  Read<signed_char> local_200;
  Dist local_1f0;
  Dist local_160;
  undefined4 local_cc;
  __cxx11 local_c8 [55];
  allocator local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [35];
  ScopedTimer local_2d [5];
  ScopedTimer omega_h_scoped_function_timer;
  Read<signed_char> *pRStack_28;
  Int width_local;
  Read<signed_char> *a_local;
  Int ent_dim_local;
  Mesh *this_local;
  
  pRVar2 = (Read<signed_char> *)CONCAT44(in_register_0000000c,width);
  pRStack_28 = pRVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.cpp"
             ,&local_91);
  std::operator+(local_70,(char *)local_90);
  std::__cxx11::to_string(local_c8,0x249);
  std::operator+(local_50,local_70);
  file = (char *)std::__cxx11::string::c_str();
  ScopedTimer::ScopedTimer(local_2d,"sync_array",file);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  bVar1 = could_be_shared((Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
  if (bVar1) {
    ask_dist(&local_1f0,(Mesh *)CONCAT44(in_register_00000034,ent_dim),(Int)a);
    Dist::invert(&local_160,&local_1f0);
    Read<signed_char>::Read(&local_200,pRVar2);
    Dist::exch<signed_char>((Dist *)this,(Read<signed_char> *)&local_160,(Int)&local_200);
    Read<signed_char>::~Read(&local_200);
    Dist::~Dist(&local_160);
    Dist::~Dist(&local_1f0);
  }
  else {
    Read<signed_char>::Read((Read<signed_char> *)this,pRVar2);
  }
  local_cc = 1;
  ScopedTimer::~ScopedTimer(local_2d);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> Mesh::sync_array(Int ent_dim, Read<T> a, Int width) {
  OMEGA_H_TIME_FUNCTION;
  if (!could_be_shared(ent_dim)) return a;
  return ask_dist(ent_dim).invert().exch(a, width);
}